

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

_Bool rm(upb_table *t,lookupkey_t key,upb_value *val,uint32_t hash,eqlfunc_t *eql)

{
  upb_key uVar1;
  _upb_tabent *p_Var2;
  upb_tabent *puVar3;
  _Bool _Var4;
  upb_tabent *move;
  _upb_tabent **pp_Var5;
  uint uVar6;
  
  uVar6 = hash & t->mask;
  uVar1 = t->entries[uVar6].key;
  if (uVar1.num != 0) {
    puVar3 = t->entries + uVar6;
    _Var4 = (*eql)(uVar1,key);
    if (_Var4) {
      t->count = t->count - 1;
      if (val != (upb_value *)0x0) {
        val->val = (puVar3->val).val;
      }
      p_Var2 = puVar3->next;
      if (p_Var2 == (_upb_tabent *)0x0) {
        (puVar3->key).num = 0;
      }
      else {
        puVar3->next = p_Var2->next;
        uVar1 = p_Var2->key;
        (puVar3->val).val = (p_Var2->val).val;
        puVar3->key = uVar1;
        (p_Var2->key).num = 0;
      }
      return true;
    }
    p_Var2 = puVar3->next;
    while (p_Var2 != (_upb_tabent *)0x0) {
      pp_Var5 = &puVar3->next;
      _Var4 = (*eql)(p_Var2->key,key);
      puVar3 = *pp_Var5;
      if (_Var4) {
        if (puVar3 == (_upb_tabent *)0x0) {
          return false;
        }
        t->count = t->count - 1;
        if (val != (upb_value *)0x0) {
          val->val = (puVar3->val).val;
        }
        (puVar3->key).num = 0;
        *pp_Var5 = puVar3->next;
        return true;
      }
      p_Var2 = puVar3->next;
    }
  }
  return false;
}

Assistant:

static bool rm(upb_table* t, lookupkey_t key, upb_value* val, uint32_t hash,
               eqlfunc_t* eql) {
  upb_tabent* chain = getentry_mutable(t, hash);
  if (upb_tabent_isempty(chain)) return false;
  if (eql(chain->key, key)) {
    /* Element to remove is at the head of its chain. */
    t->count--;
    if (val) *val = chain->val;
    if (chain->next) {
      upb_tabent* move = (upb_tabent*)chain->next;
      *chain = *move;
      move->key = upb_key_empty();
    } else {
      chain->key = upb_key_empty();
    }
    return true;
  } else {
    /* Element to remove is either in a non-head position or not in the
     * table. */
    while (chain->next && !eql(chain->next->key, key)) {
      chain = (upb_tabent*)chain->next;
    }
    if (chain->next) {
      /* Found element to remove. */
      upb_tabent* rm = (upb_tabent*)chain->next;
      t->count--;
      if (val) *val = chain->next->val;
      rm->key = upb_key_empty();
      chain->next = rm->next;
      return true;
    } else {
      /* Element to remove is not in the table. */
      return false;
    }
  }
}